

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlWalkValidateList(void *data,void *user)

{
  byte bVar1;
  xmlValidCtxtPtr ctxt;
  xmlChar *cur;
  long lVar2;
  xmlAttrPtr pxVar3;
  ulong uVar4;
  byte *pbVar5;
  xmlValidateMemoPtr memo;
  byte *pbVar6;
  byte *pbVar7;
  
  if (data == (void *)0x0) {
    return 1;
  }
  ctxt = *user;
  cur = *(xmlChar **)((long)user + 8);
  lVar2 = *(long *)((long)data + 0x10);
  if (lVar2 == 0) {
    if (*(long *)((long)data + 0x18) == 0) {
      return 1;
    }
    pbVar5 = xmlStrdup(cur);
    if (pbVar5 == (byte *)0x0) {
      xmlVErrMemory(ctxt);
      return 1;
    }
    pbVar7 = pbVar5;
    pbVar6 = pbVar5;
    if (*pbVar5 != 0) {
      do {
        while( true ) {
          bVar1 = *pbVar7;
          if (((ulong)bVar1 < 0x21) && ((0x100002601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
          pbVar7 = pbVar7 + 1;
        }
        *pbVar7 = 0;
        pxVar3 = xmlGetID(ctxt->doc,pbVar6);
        if (pxVar3 == (xmlAttrPtr)0x0) {
          xmlDoErrValid(ctxt,(xmlNodePtr)0x0,XML_DTD_UNKNOWN_ID,2,*(xmlChar **)((long)data + 0x18),
                        pbVar6,(xmlChar *)0x0,*(uint *)((long)data + 0x20),
                        "attribute %s line %d references an unknown ID \"%s\"\n",
                        *(xmlChar **)((long)data + 0x18),(ulong)*(uint *)((long)data + 0x20),pbVar6)
          ;
          ctxt->valid = 0;
        }
        if (bVar1 == 0) break;
        *pbVar7 = bVar1;
        for (; uVar4 = (ulong)*pbVar7, pbVar6 = pbVar7, uVar4 < 0x21; pbVar7 = pbVar7 + 1) {
          if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
            if (uVar4 == 0) goto LAB_0015bece;
            break;
          }
        }
      } while( true );
    }
  }
  else {
    if (*(int *)(lVar2 + 0x50) != 4) {
      if (*(int *)(lVar2 + 0x50) != 3) {
        return 1;
      }
      pxVar3 = xmlGetID(ctxt->doc,cur);
      if (pxVar3 != (xmlAttrPtr)0x0) {
        return 1;
      }
      xmlDoErrValid(ctxt,*(xmlNodePtr *)(lVar2 + 0x28),XML_DTD_UNKNOWN_ID,2,
                    *(xmlChar **)(lVar2 + 0x10),cur,(xmlChar *)0x0,0,
                    "IDREF attribute %s references an unknown ID \"%s\"\n",
                    *(xmlChar **)(lVar2 + 0x10),cur,0);
      ctxt->valid = 0;
      return 1;
    }
    pbVar5 = xmlStrdup(cur);
    if (pbVar5 == (byte *)0x0) {
      xmlVErrMemory(ctxt);
      ctxt->valid = 0;
      return 1;
    }
    pbVar7 = pbVar5;
    pbVar6 = pbVar5;
    if (*pbVar5 != 0) {
      do {
        while( true ) {
          bVar1 = *pbVar7;
          if (((ulong)bVar1 < 0x21) && ((0x100002601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
          pbVar7 = pbVar7 + 1;
        }
        *pbVar7 = 0;
        pxVar3 = xmlGetID(ctxt->doc,pbVar6);
        if (pxVar3 == (xmlAttrPtr)0x0) {
          xmlDoErrValid(ctxt,*(xmlNodePtr *)(lVar2 + 0x28),XML_DTD_UNKNOWN_ID,2,
                        *(xmlChar **)(lVar2 + 0x10),pbVar6,(xmlChar *)0x0,0,
                        "IDREFS attribute %s references an unknown ID \"%s\"\n",
                        *(xmlChar **)(lVar2 + 0x10),pbVar6,0);
          ctxt->valid = 0;
        }
        if (bVar1 == 0) break;
        *pbVar7 = bVar1;
        for (; uVar4 = (ulong)*pbVar7, pbVar6 = pbVar7, uVar4 < 0x21; pbVar7 = pbVar7 + 1) {
          if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
            if (uVar4 == 0) goto LAB_0015bece;
            break;
          }
        }
      } while( true );
    }
  }
LAB_0015bece:
  (*xmlFree)(pbVar5);
  return 1;
}

Assistant:

static void
xmlValidateRef(xmlRefPtr ref, xmlValidCtxtPtr ctxt,
	                   const xmlChar *name) {
    xmlAttrPtr id;
    xmlAttrPtr attr;

    if (ref == NULL)
	return;
    if ((ref->attr == NULL) && (ref->name == NULL))
	return;
    attr = ref->attr;
    if (attr == NULL) {
	xmlChar *dup, *str = NULL, *cur, save;

	dup = xmlStrdup(name);
	if (dup == NULL) {
            xmlVErrMemory(ctxt);
	    return;
	}
	cur = dup;
	while (*cur != 0) {
	    str = cur;
	    while ((*cur != 0) && (!IS_BLANK_CH(*cur))) cur++;
	    save = *cur;
	    *cur = 0;
	    id = xmlGetID(ctxt->doc, str);
	    if (id == NULL) {
		xmlErrValidNodeNr(ctxt, NULL, XML_DTD_UNKNOWN_ID,
	   "attribute %s line %d references an unknown ID \"%s\"\n",
		       ref->name, ref->lineno, str);
		ctxt->valid = 0;
	    }
	    if (save == 0)
		break;
	    *cur = save;
	    while (IS_BLANK_CH(*cur)) cur++;
	}
	xmlFree(dup);
    } else if (attr->atype == XML_ATTRIBUTE_IDREF) {
	id = xmlGetID(ctxt->doc, name);
	if (id == NULL) {
	    xmlErrValidNode(ctxt, attr->parent, XML_DTD_UNKNOWN_ID,
	   "IDREF attribute %s references an unknown ID \"%s\"\n",
		   attr->name, name, NULL);
	    ctxt->valid = 0;
	}
    } else if (attr->atype == XML_ATTRIBUTE_IDREFS) {
	xmlChar *dup, *str = NULL, *cur, save;

	dup = xmlStrdup(name);
	if (dup == NULL) {
	    xmlVErrMemory(ctxt);
	    ctxt->valid = 0;
	    return;
	}
	cur = dup;
	while (*cur != 0) {
	    str = cur;
	    while ((*cur != 0) && (!IS_BLANK_CH(*cur))) cur++;
	    save = *cur;
	    *cur = 0;
	    id = xmlGetID(ctxt->doc, str);
	    if (id == NULL) {
		xmlErrValidNode(ctxt, attr->parent, XML_DTD_UNKNOWN_ID,
	   "IDREFS attribute %s references an unknown ID \"%s\"\n",
			     attr->name, str, NULL);
		ctxt->valid = 0;
	    }
	    if (save == 0)
		break;
	    *cur = save;
	    while (IS_BLANK_CH(*cur)) cur++;
	}
	xmlFree(dup);
    }
}